

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LZWcompress.cpp
# Opt level: O2

void __thiscall LZWcompress::LZWcompress(LZWcompress *this,uchar *YUVdata,uint size)

{
  _Rb_tree_header *p_Var1;
  ulong uVar2;
  string sStack_48;
  
  (this->YUVdata_n).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->YUVdata_n).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->YUVdata_n).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  p_Var1 = &(this->encode_map)._M_t._M_impl.super__Rb_tree_header;
  (this->encode_map)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->encode_map)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->encode_map)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->encode_map)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->encode_map)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->decode_map)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->decode_map)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  p_Var1 = &(this->decode_map)._M_t._M_impl.super__Rb_tree_header;
  (this->decode_map)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->decode_map)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->decode_map)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->lzw_encode_output).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->lzw_decode_output).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->lzw_encode_output).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->lzw_encode_output).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->lzw_decode_output).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->lzw_decode_output).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  for (uVar2 = 0; size != uVar2; uVar2 = uVar2 + 1) {
    std::__cxx11::to_string(&sStack_48,(uint)YUVdata[uVar2]);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)this,&sStack_48)
    ;
    std::__cxx11::string::~string((string *)&sStack_48);
  }
  return;
}

Assistant:

LZWcompress::LZWcompress(uchar * YUVdata, uint size){
	for(uint i = 0; i < size; i++){
		YUVdata_n.push_back(std::to_string(int(YUVdata[i])));
	}
}